

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void CallExpression_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  int iVar1;
  JsLocation *data;
  int iVar2;
  JsValue *res_00;
  void *pvVar3;
  long lVar4;
  JsVm *pJVar5;
  undefined1 local_68 [8];
  JsValue r3;
  JsValue r1;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r3.u + 8));
  iVar1 = *(int *)&na[1].location[1].filename;
  if ((long)iVar1 < 1) {
    pvVar3 = (void *)0x0;
  }
  else {
    res_00 = (JsValue *)JsMalloc(iVar1 * 0x18);
    pvVar3 = JsMalloc(iVar1 * 8);
    Arguments_eval((JsAstNode *)na[1].location,context,res_00);
    lVar4 = 0;
    do {
      *(JsValue **)((long)pvVar3 + lVar4 * 8) = res_00;
      lVar4 = lVar4 + 1;
      res_00 = res_00 + 1;
    } while (iVar1 != lVar4);
  }
  data = na->location;
  JsGetValue((JsValue *)((long)&r3.u + 8),(JsValue *)local_68);
  if (local_68._0_4_ == JS_UNDEFINED) {
    JsThrowString("no such function");
  }
  if (local_68._0_4_ != JS_OBJECT) {
    JsThrowString("not a function");
  }
  if (*(long *)(r3._0_8_ + 0x68) == 0) {
    JsThrowString("not callable function");
  }
  if (((r3.u.completion.type != (JS_COMPLETION_THROW|JS_COMPLETION_CONTINUE)) || (r1._0_8_ == 0)) ||
     (iVar2 = strcmp(*(char **)(r1._0_8_ + 8),"Activation"), iVar2 == 0)) {
    pJVar5 = JsGetVm();
    r1._0_8_ = pJVar5->Global;
  }
  JsListPush(context->stack,data);
  context->pc = data;
  pJVar5 = JsGetVm();
  if ((pJVar5->debug == 1) && (pJVar5 = JsGetVm(), pJVar5->trace != (JsVmTraceFn)0x0)) {
    pJVar5 = JsGetVm();
    (*pJVar5->trace)(context->engine,data,JS_TRACE_CALL);
  }
  (**(code **)(r3._0_8_ + 0x68))(r3._0_8_,r1._0_8_,iVar1,pvVar3,res);
  context->pc = data;
  pJVar5 = JsGetVm();
  if ((pJVar5->debug == 1) && (pJVar5 = JsGetVm(), pJVar5->trace != (JsVmTraceFn)0x0)) {
    pJVar5 = JsGetVm();
    (*pJVar5->trace)(context->engine,data,JS_TRACE_RETURN);
  }
  JsListRemove(context->stack,-1);
  return;
}

Assistant:

static void
CallExpression_eval(na, context, res)
	struct JsAstNode *na; /* (struct CallExpression_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstCallExpressionNode *n = CAST_NODE(na, JsAstCallExpressionNode);
	struct JsValue r1, *args, **argv;
	int argc, i;

	EVAL(n->exp, context, &r1);
	argc = n->args->argc;
	if (argc > 0) {
		args = (struct JsValue*)JsMalloc( sizeof(struct JsValue) * argc);
		argv = (struct JsValue**)JsMalloc( sizeof(struct JsValue*) * argc);
		Arguments_eval((struct JsAstNode *)n->args, context, args);
		for (i = 0; i < argc; i++)
			argv[i] = &args[i];
	}else 
		argv = NULL;
	CallExpression_eval_common(context, na->location, &r1, argc, argv, res);
}